

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DMipmapTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DMipmapTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  CoordType CVar1;
  FilterMode FVar2;
  TestLog *pTVar3;
  float fVar4;
  Texture2DMipmapTestInstance *pTVar5;
  float fVar6;
  deUint32 dVar7;
  int iVar8;
  TextureFormat format;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar9;
  Texture2DView *baseView;
  Surface *pSVar10;
  byte bVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int curY;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int x;
  undefined1 auVar16 [16];
  allocator<char> local_4af;
  allocator<char> local_4ae;
  allocator<char> local_4ad;
  CoordType local_4ac;
  float local_4a8;
  float local_4a4;
  long local_4a0;
  Texture2DMipmapTestInstance *local_498;
  deUint32 local_48c;
  float local_488;
  uint local_484;
  TestStatus *local_480;
  long local_478;
  long local_470;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  Texture2DView local_438;
  ConstPixelBufferAccess local_428;
  PixelBufferAccess local_400;
  PixelBufferAccess local_3d8;
  PixelFormat local_3a8;
  long local_390;
  Surface referenceFrame;
  Surface renderedFrame;
  PixelBufferAccess local_358;
  Surface errorMask;
  undefined1 local_318 [32];
  size_type sStack_2f8;
  BVec4 local_2f0;
  IVec4 formatBitDepth;
  undefined1 local_2d4 [76];
  size_type sStack_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  int local_270;
  anon_union_16_3_1194ccdc_for_v local_26c;
  undefined8 local_25c;
  LodMode local_254;
  LogImage local_240;
  undefined1 local_1b0 [32];
  int local_190;
  anon_union_16_3_1194ccdc_for_v local_18c [21];
  
  this_00 = &this->m_renderer;
  local_480 = __return_storage_ptr__;
  fVar6 = (float)util::TextureRenderer::getRenderWidth(this_00);
  dVar7 = util::TextureRenderer::getRenderHeight(this_00);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2d4,TEXTURETYPE_2D);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4ac = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
  tcu::Surface::Surface(&renderedFrame,(int)fVar6,dVar7);
  local_4a4 = (float)((int)fVar6 / 4);
  local_484 = (int)dVar7 / 4;
  util::createSampler((Sampler *)local_1b0,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,NEAREST);
  local_270 = local_190;
  local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )local_1b0._16_16_;
  local_2d4._68_8_ = local_1b0._0_8_;
  sStack_288 = local_1b0._8_8_;
  local_26c._0_8_ = local_18c[0]._0_8_;
  local_26c._8_8_ = local_18c[0]._8_8_;
  local_25c = local_18c[1]._0_8_;
  format = ::vk::mapVkFormat((this->m_testParameters).super_Texture2DTestCaseParameters.
                             super_TextureCommonTestCaseParameters.format);
  local_2d4._4_4_ = glu::TextureTestUtil::getSamplerType(format);
  local_2d4._8_4_ =
       (uint)(local_4ac == COORDTYPE_PROJECTED) + (uint)(local_4ac == COORDTYPE_BASIC_BIAS) * 2;
  local_254 = LODMODE_EXACT;
  if (texture::(anonymous_namespace)::Texture2DMipmapTestInstance::iterate()::s_projections == '\0')
  {
    iVar8 = __cxa_guard_acquire();
    if (iVar8 != 0) {
      iterate::s_projections[0].m_data[0] = _DAT_009cad70;
      iterate::s_projections[0].m_data[1] = _UNK_009cad74;
      iterate::s_projections[0].m_data[2] = _UNK_009cad78;
      iterate::s_projections[0].m_data[3] = _UNK_009cad7c;
      iterate::s_projections[1].m_data[0] = _DAT_009cad80;
      iterate::s_projections[1].m_data[1] = _UNK_009cad84;
      iterate::s_projections[1].m_data[2] = _UNK_009cad88;
      iterate::s_projections[1].m_data[3] = _UNK_009cad8c;
      iterate::s_projections[2].m_data[0] = _DAT_009cad90;
      iterate::s_projections[2].m_data[1] = _UNK_009cad94;
      iterate::s_projections[2].m_data[2] = _UNK_009cad98;
      iterate::s_projections[2].m_data[3] = _UNK_009cad9c;
      iterate::s_projections[3].m_data[0] = _DAT_009cada0;
      iterate::s_projections[3].m_data[1] = _UNK_009cada4;
      iterate::s_projections[3].m_data[2] = _UNK_009cada8;
      iterate::s_projections[3].m_data[3] = _UNK_009cadac;
      __cxa_guard_release();
    }
  }
  lVar13 = 0;
  lVar14 = 0;
  local_498 = this;
  local_48c = dVar7;
  local_488 = fVar6;
  do {
    fVar6 = local_488;
    dVar7 = local_48c;
    if (lVar14 == 4) {
      local_1b0._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
      tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_1b0);
      local_3a8.redBits = formatBitDepth.m_data[0];
      local_3a8.greenBits = formatBitDepth.m_data[1];
      local_3a8.blueBits = formatBitDepth.m_data[2];
      local_3a8.alphaBits = formatBitDepth.m_data[3];
      FVar2 = (local_498->m_testParameters).super_Texture2DTestCaseParameters.
              super_TextureCommonTestCaseParameters.minFilter;
      tcu::Surface::Surface(&referenceFrame,(int)fVar6,dVar7);
      tcu::Surface::Surface(&errorMask,(int)fVar6,dVar7);
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_318);
      lodPrec.rule = RULE_VULKAN;
      lodPrec.derivateBits = 0x16;
      lodPrec.lodBits = 0x10;
      local_318._0_4_ = 0x14;
      local_318._4_4_ = 0x14;
      local_318._8_4_ = 0;
      local_318._12_4_ = 0x10;
      local_318._16_4_ = 0x10;
      local_318._20_4_ = 0;
      local_3d8.super_ConstPixelBufferAccess.m_format.order = local_3a8.redBits;
      local_3d8.super_ConstPixelBufferAccess.m_format.type = local_3a8.greenBits;
      local_3d8.super_ConstPixelBufferAccess.m_size.m_data[0] = local_3a8.blueBits;
      local_3d8.super_ConstPixelBufferAccess.m_size.m_data[1] = local_3a8.alphaBits;
      tcu::operator-((tcu *)&local_428,(Vector<int,_4> *)&local_3d8,
                     ((FVar2 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0) + 1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_400,0);
      tcu::max<int,4>((tcu *)&local_240,(Vector<int,_4> *)&local_428,(Vector<int,_4> *)&local_400);
      tcu::computeFixedPointThreshold((tcu *)local_1b0,(IVec4 *)&local_240);
      local_318._24_8_ = local_1b0._0_8_;
      sStack_2f8 = local_1b0._8_8_;
      auVar16._0_4_ = -(uint)(0 < local_3a8.redBits);
      auVar16._4_4_ = -(uint)(0 < local_3a8.greenBits);
      auVar16._8_4_ = -(uint)(0 < local_3a8.blueBits);
      auVar16._12_4_ = -(uint)(0 < local_3a8.alphaBits);
      uVar9 = movmskps((int)&local_3a8,auVar16);
      bVar11 = (byte)uVar9;
      local_2f0.m_data =
           (bool  [4])
           (uVar9 & 1 | (uint)((bVar11 & 2) >> 1) << 8 | (uint)((bVar11 & 4) >> 2) << 0x10 |
           (uint)(bVar11 >> 3) << 0x18);
      baseView = (Texture2DView *)&lodPrec;
      lodPrec.derivateBits = 10;
      lodPrec.lodBits = (uint)(local_4ac != COORDTYPE_PROJECTED) * 2 + 6;
      lVar14 = 0;
      lVar13 = 0;
      iVar8 = 0;
      do {
        pTVar5 = local_498;
        if (lVar13 == 4) {
          if (0 < iVar8) {
            local_1b0._0_8_ = ((local_498->super_TestInstance).m_context)->m_testCtx->m_log;
            this_01 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_01);
            std::operator<<((ostream *)this_01,"ERROR: Image verification failed, found ");
            std::ostream::operator<<(this_01,iVar8);
            std::operator<<((ostream *)this_01," invalid pixels!");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_01);
          }
          pTVar3 = ((pTVar5->super_TestInstance).m_context)->m_testCtx->m_log;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"Result",(allocator<char> *)&local_438);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,"Verification result",&local_4ad);
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_240,(string *)&local_428,(string *)&local_3d8);
          iVar12 = (int)pTVar3;
          tcu::LogImageSet::write((LogImageSet *)&local_240,iVar12,__buf,(size_t)baseView);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,"Rendered",&local_4ae);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,"Rendered image",&local_4af);
          pSVar10 = &renderedFrame;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b0,(string *)&local_400,(string *)&local_358,pSVar10,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b0,iVar12,__buf_00,(size_t)pSVar10);
          tcu::LogImage::~LogImage((LogImage *)local_1b0);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_400);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::__cxx11::string::~string((string *)&local_428);
          if (0 < iVar8) {
            pTVar3 = ((pTVar5->super_TestInstance).m_context)->m_testCtx->m_log;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_428,"Reference",(allocator<char> *)&local_438);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d8,"Ideal reference",&local_4ad);
            pSVar10 = &referenceFrame;
            tcu::LogImage::LogImage
                      ((LogImage *)local_1b0,(string *)&local_428,(string *)&local_3d8,pSVar10,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            iVar12 = (int)pTVar3;
            tcu::LogImage::write((LogImage *)local_1b0,iVar12,__buf_01,(size_t)pSVar10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_400,"ErrorMask",&local_4ae);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_358,"Error mask",&local_4af);
            pSVar10 = &errorMask;
            tcu::LogImage::LogImage
                      (&local_240,(string *)&local_400,(string *)&local_358,pSVar10,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write(&local_240,iVar12,__buf_02,(size_t)pSVar10);
            tcu::LogImage::~LogImage(&local_240);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)&local_400);
            tcu::LogImage::~LogImage((LogImage *)local_1b0);
            std::__cxx11::string::~string((string *)&local_3d8);
            std::__cxx11::string::~string((string *)&local_428);
          }
          tcu::TestLog::endImageSet(((pTVar5->super_TestInstance).m_context)->m_testCtx->m_log);
          if (iVar8 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b0,"pass",(allocator<char> *)&local_240);
            tcu::TestStatus::pass(local_480,(string *)local_1b0);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b0,"fail",(allocator<char> *)&local_240);
            tcu::TestStatus::fail(local_480,(string *)local_1b0);
          }
          std::__cxx11::string::~string((string *)local_1b0);
          tcu::Surface::~Surface(&errorMask);
          tcu::Surface::~Surface(&referenceFrame);
          tcu::Surface::~Surface(&renderedFrame);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
          return local_480;
        }
        baseView = (Texture2DView *)(ulong)local_484;
        iVar12 = local_484 * (int)lVar13;
        uVar9 = dVar7 - iVar12;
        if (lVar13 != 3) {
          uVar9 = local_484;
        }
        x = 0;
        local_4a8 = fVar6;
        local_4a0 = lVar14;
        local_478 = lVar14;
        local_390 = lVar13;
        for (lVar15 = 0; lVar15 != 0x40; lVar15 = lVar15 + 0x10) {
          local_470 = CONCAT44(local_470._4_4_,iVar8);
          fVar6 = local_4a4;
          if (lVar15 == 0x30) {
            fVar6 = local_4a8;
          }
          CVar1 = (local_498->m_testParameters).super_TextureMipmapCommonTestCaseParameters.
                  coordType;
          if (CVar1 < COORDTYPE_AFFINE) {
LAB_0075fd00:
            getBasicTexCoord2D(&texCoord,(int)local_4a0);
          }
          else if (CVar1 == COORDTYPE_AFFINE) {
            getAffineTexCoord2D(&texCoord,(int)local_4a0);
          }
          else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_0075fd00;
          if (local_4ac == COORDTYPE_PROJECTED) {
            local_2d4._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar15);
            local_2d4._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar15 + 8);
          }
          else if (local_4ac == COORDTYPE_BASIC_BIAS) {
            local_2d4._28_4_ = iterate::s_bias[(uint)local_4a0 & 7];
          }
          tcu::SurfaceAccess::SurfaceAccess
                    ((SurfaceAccess *)local_1b0,&referenceFrame,&local_3a8,x,iVar12,(int)fVar6,uVar9
                    );
          iVar8 = (*(((local_498->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
          local_240.m_name._M_dataplus._M_p._0_4_ =
               *(undefined4 *)(CONCAT44(extraout_var,iVar8) + 0x40);
          local_240.m_name._M_string_length = *(size_type *)(CONCAT44(extraout_var,iVar8) + 0x48);
          glu::TextureTestUtil::sampleTexture
                    ((SurfaceAccess *)local_1b0,(Texture2DView *)&local_240,
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(ReferenceParams *)local_2d4);
          tcu::Surface::getAccess((PixelBufferAccess *)&local_240,&renderedFrame);
          tcu::getSubregion((PixelBufferAccess *)local_1b0,(PixelBufferAccess *)&local_240,x,iVar12,
                            (int)fVar6,uVar9);
          tcu::Surface::getAccess(&local_3d8,&referenceFrame);
          tcu::getSubregion((PixelBufferAccess *)&local_428,&local_3d8,x,iVar12,(int)fVar6,uVar9);
          tcu::Surface::getAccess(&local_358,&errorMask);
          tcu::getSubregion(&local_400,&local_358,x,iVar12,(int)fVar6,uVar9);
          pTVar5 = local_498;
          iVar8 = (*(((local_498->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
          local_438.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar8) + 0x40);
          local_438.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar8) + 0x48);
          baseView = &local_438;
          iVar8 = glu::TextureTestUtil::computeTextureLookupDiff
                            ((ConstPixelBufferAccess *)local_1b0,&local_428,&local_400,baseView,
                             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start,(ReferenceParams *)local_2d4,
                             (LookupPrecision *)local_318,&lodPrec,
                             ((pTVar5->super_TestInstance).m_context)->m_testCtx->m_watchDog);
          iVar8 = (int)local_470 + iVar8;
          local_4a0 = local_4a0 + 1;
          local_4a8 = (float)((int)local_4a8 - (int)local_4a4);
          x = x + (int)local_4a4;
        }
        lVar13 = local_390 + 1;
        lVar14 = local_478 + 4;
        fVar6 = local_488;
        dVar7 = local_48c;
      } while( true );
    }
    iVar8 = local_484 * (int)lVar14;
    uVar9 = local_48c - iVar8;
    if (lVar14 != 3) {
      uVar9 = local_484;
    }
    local_4a0 = CONCAT44(local_4a0._4_4_,(float)iVar8);
    local_4a8 = (float)(int)uVar9;
    iVar8 = 0;
    local_478 = lVar14;
    local_470 = lVar13;
    for (lVar15 = 0; lVar15 != 0x40; lVar15 = lVar15 + 0x10) {
      fVar4 = local_4a4;
      if (lVar15 == 0x30) {
        fVar4 = fVar6;
      }
      CVar1 = (local_498->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
      uVar9 = (uint)lVar13;
      if (CVar1 < COORDTYPE_AFFINE) {
LAB_0075fa2d:
        getBasicTexCoord2D(&texCoord,uVar9);
      }
      else if (CVar1 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,uVar9);
      }
      else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_0075fa2d;
      if (local_4ac == COORDTYPE_PROJECTED) {
        local_2d4._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar15);
        local_2d4._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar15 + 8);
      }
      else if (local_4ac == COORDTYPE_BASIC_BIAS) {
        local_2d4._28_4_ = iterate::s_bias[uVar9 & 7];
      }
      util::TextureRenderer::setViewport
                (this_00,(float)iVar8,(float)local_4a0,(float)(int)fVar4,local_4a8);
      lVar13 = lVar13 + 1;
      fVar6 = (float)((int)fVar6 - (int)local_4a4);
      iVar8 = iVar8 + (int)local_4a4;
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_2d4);
    }
    lVar14 = local_478 + 1;
    lVar13 = local_470 + 4;
  } while( true );
}

Assistant:

tcu::TestStatus Texture2DMipmapTestInstance::iterate (void)
{
	const Sampler::FilterMode	magFilter		= Sampler::NEAREST;
	const int					viewportWidth	= m_renderer.getRenderWidth();
	const int					viewportHeight	= m_renderer.getRenderHeight();

	ReferenceParams				refParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	const bool					isProjected		= m_testParameters.coordType == COORDTYPE_PROJECTED;
	const bool					useLodBias		= m_testParameters.coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame	(viewportWidth, viewportHeight);

	// Viewport is divided into 4x4 grid.
	const int					gridWidth		= 4;
	const int					gridHeight		= 4;
	const int					cellWidth		= viewportWidth / gridWidth;
	const int					cellHeight		= viewportHeight / gridHeight;

	// Sampling parameters.
	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, magFilter);
	refParams.samplerType	= getSamplerType(vk::mapVkFormat(m_testParameters.format));
	refParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	refParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int	curX		= cellWidth*gridX;
			const int	curY		= cellHeight*gridY;
			const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
			const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
			const int	cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_testParameters.coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				refParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				refParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
			m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
		}
	}

	// Compare and log.
	{
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const bool				isTrilinear		= m_testParameters.minFilter == Sampler::NEAREST_MIPMAP_LINEAR || m_testParameters.minFilter == Sampler::LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewportWidth, viewportHeight);
		tcu::Surface			errorMask		(viewportWidth, viewportHeight);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_VULKAN);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int	curX		= cellWidth*gridX;
				const int	curY		= cellHeight*gridY;
				const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
				const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
				const int	cellNdx		= gridY*gridWidth + gridX;

				// Compute texcoord.
				switch (m_testParameters.coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					refParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					refParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  m_texture->getTexture(), &texCoord[0], refParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getTexture(), &texCoord[0], refParams,
															lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}